

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabBarRemoveTab(ImGuiTabBar *tab_bar,ImGuiID tab_id)

{
  ulong uVar1;
  ulong uVar2;
  size_t __n;
  ImGuiTabItem *__dest;
  
  if ((tab_id != 0) && (uVar1 = (ulong)(tab_bar->Tabs).Size, 0 < (long)uVar1)) {
    __dest = (tab_bar->Tabs).Data;
    __n = uVar1 * 0x20 - 0x20;
    uVar2 = 0;
    do {
      if (__dest->ID == tab_id) {
        if (uVar1 <= uVar2) {
          __assert_fail("it >= Data && it < Data+Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.h"
                        ,0x4ef,"T *ImVector<ImGuiTabItem>::erase(const T *) [T = ImGuiTabItem]");
        }
        memmove(__dest,__dest + 1,__n);
        (tab_bar->Tabs).Size = (tab_bar->Tabs).Size + -1;
        break;
      }
      uVar2 = uVar2 + 1;
      __n = __n - 0x20;
      __dest = __dest + 1;
    } while (__n != 0xffffffffffffffe0);
  }
  if (tab_bar->VisibleTabId == tab_id) {
    tab_bar->VisibleTabId = 0;
  }
  if (tab_bar->SelectedTabId == tab_id) {
    tab_bar->SelectedTabId = 0;
  }
  if (tab_bar->NextSelectedTabId == tab_id) {
    tab_bar->NextSelectedTabId = 0;
  }
  return;
}

Assistant:

void ImGui::TabBarRemoveTab(ImGuiTabBar* tab_bar, ImGuiID tab_id)
{
    if (ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, tab_id))
        tab_bar->Tabs.erase(tab);
    if (tab_bar->VisibleTabId == tab_id)      { tab_bar->VisibleTabId = 0; }
    if (tab_bar->SelectedTabId == tab_id)     { tab_bar->SelectedTabId = 0; }
    if (tab_bar->NextSelectedTabId == tab_id) { tab_bar->NextSelectedTabId = 0; }
}